

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBinaryReader::WasmBinaryReader
          (WasmBinaryReader *this,ArenaAllocator *alloc,WebAssemblyModule *module,byte *source,
          size_t length)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  TrackAllocData local_58;
  size_t local_30;
  size_t length_local;
  byte *source_local;
  WebAssemblyModule *module_local;
  ArenaAllocator *alloc_local;
  WasmBinaryReader *this_local;
  
  local_30 = length;
  length_local = (size_t)source;
  source_local = (byte *)module;
  module_local = (WebAssemblyModule *)alloc;
  alloc_local = (ArenaAllocator *)this;
  WasmReaderBase::WasmReaderBase(&this->super_WasmReaderBase);
  (this->super_WasmReaderBase)._vptr_WasmReaderBase = (_func_int **)&PTR_SeekToFunctionBody_01e513b0
  ;
  this->m_alloc = (ArenaAllocator *)module_local;
  this->m_start = (byte *)length_local;
  this->m_end = (byte *)(length_local + local_30);
  this->m_pc = (byte *)length_local;
  this->m_curFuncEnd = (byte *)0x0;
  (this->m_currentSection).end = (byte *)0x0;
  *(undefined8 *)&(this->m_currentSection).nameLength = 0;
  *(undefined8 *)&this->m_currentSection = 0;
  (this->m_currentSection).start = (byte *)0x0;
  (this->m_currentSection).name = (char16 *)0x0;
  ReaderState::ReaderState(&this->m_funcState);
  this->m_readerState = READER_STATE_UNKNOWN;
  this->m_module = (WebAssemblyModule *)source_local;
  this->m_ops = (OpSet *)0x0;
  (this->m_currentSection).code = bSectLimit;
  pAVar1 = &this->m_alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &JsUtil::
              BaseHashSet<Wasm::WasmOp,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Wasm::WasmOp,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
             ,0x20);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_58);
  this_00 = (BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
  JsUtil::
  BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(this_00,this->m_alloc,0);
  this->m_ops = this_00;
  return;
}

Assistant:

WasmBinaryReader::WasmBinaryReader(ArenaAllocator* alloc, Js::WebAssemblyModule* module, const byte* source, size_t length) :
    m_alloc(alloc),
    m_start(source),
    m_end(source + length),
    m_pc(source),
    m_curFuncEnd(nullptr),
    m_currentSection(),
    m_readerState(READER_STATE_UNKNOWN),
    m_module(module)
#if DBG_DUMP
    , m_ops(nullptr)
#endif
{
    m_currentSection.code = bSectLimit;
#if DBG_DUMP
    m_ops = Anew(m_alloc, OpSet, m_alloc);
#endif
}